

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

double calculate_modified_err_new
                 (FRAME_INFO *frame_info,FIRSTPASS_STATS *total_stats,FIRSTPASS_STATS *this_stats,
                 int vbrbias,double modified_error_min,double modified_error_max)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (total_stats != (FIRSTPASS_STATS *)0x0) {
    dVar4 = ((total_stats->weight / total_stats->count) * total_stats->coded_error) /
            total_stats->count;
    dVar1 = pow((this_stats->coded_error * this_stats->weight) /
                (*(double *)(&DAT_004e2df0 + (ulong)(dVar4 < 0.0) * 8) + dVar4),
                (double)vbrbias / 100.0);
    dVar2 = 1.0 - ((this_stats->inactive_zone_rows * 2.0) / (double)frame_info->mb_rows +
                  this_stats->intra_skip_pct * 0.5);
    dVar3 = 1.0;
    if (dVar2 <= 1.0) {
      dVar3 = dVar2;
    }
    dVar3 = pow((double)(-(ulong)(dVar2 < 0.5) & 0x3fe0000000000000 |
                        ~-(ulong)(dVar2 < 0.5) & (ulong)dVar3),0.5);
    dVar3 = dVar3 * dVar1 * dVar4;
    if (dVar3 <= modified_error_max) {
      modified_error_max = dVar3;
    }
    return (double)(-(ulong)(dVar3 < modified_error_min) & (ulong)modified_error_min |
                   ~-(ulong)(dVar3 < modified_error_min) & (ulong)modified_error_max);
  }
  return 0.0;
}

Assistant:

static double calculate_modified_err_new(const FRAME_INFO *frame_info,
                                         const FIRSTPASS_STATS *total_stats,
                                         const FIRSTPASS_STATS *this_stats,
                                         int vbrbias, double modified_error_min,
                                         double modified_error_max) {
  if (total_stats == NULL) {
    return 0;
  }
  const double av_weight = total_stats->weight / total_stats->count;
  const double av_err =
      (total_stats->coded_error * av_weight) / total_stats->count;
  double modified_error =
      av_err * pow(this_stats->coded_error * this_stats->weight /
                       DOUBLE_DIVIDE_CHECK(av_err),
                   vbrbias / 100.0);

  // Correction for active area. Frames with a reduced active area
  // (eg due to formatting bars) have a higher error per mb for the
  // remaining active MBs. The correction here assumes that coding
  // 0.5N blocks of complexity 2X is a little easier than coding N
  // blocks of complexity X.
  modified_error *=
      pow(calculate_active_area(frame_info, this_stats), ACT_AREA_CORRECTION);

  return fclamp(modified_error, modified_error_min, modified_error_max);
}